

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptReflect.cpp
# Opt level: O1

Var Js::JavascriptReflect::EntryDefineProperty(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  undefined4 *puVar5;
  Var pvVar6;
  RecyclableObject *argument;
  RecyclableObject *pRVar7;
  PropertyRecord *pPVar8;
  Type TVar9;
  int in_stack_00000010;
  undefined1 local_c0 [8];
  PropertyDescriptor propertyDescriptor;
  undefined1 local_80 [8];
  AutoTagNativeLibraryEntry __tag;
  CallInfo callInfo_local;
  PropertyRecord *propertyRecord;
  ArgumentReader args;
  
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  __tag.entry.next = (Entry *)callInfo;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  if (in_stack_00000010 != (int)__tag.entry.next) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptReflect.cpp"
                                ,0xd,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) goto LAB_00d0fee3;
    *puVar5 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  propertyRecord = (PropertyRecord *)__tag.entry.next;
  ArgumentReader::AdjustArguments((ArgumentReader *)&propertyRecord,(CallInfo *)&__tag.entry.next);
  args.super_Arguments.Values =
       (Type)(((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
             scriptContext.ptr;
  pRVar7 = (((((ScriptContext *)args.super_Arguments.Values)->super_ScriptContextBase).
            javascriptLibrary)->super_JavascriptLibraryBase).undefinedValue.ptr;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_80,function,(CallInfo)__tag.entry.next,
             L"Reflect.defineProperty",&stack0x00000000);
  if (((ulong)propertyRecord & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptReflect.cpp"
                                ,0x12,"(args.Info.Count > 0)","Should always have implicit \'this\'"
                               );
    if (!bVar2) goto LAB_00d0fee3;
    *puVar5 = 0;
  }
  if (((uint)propertyRecord >> 0x18 & 1) != 0) {
    JavascriptError::ThrowTypeError
              ((ScriptContext *)args.super_Arguments.Values,-0x7ff5ebf5,L"Reflect.defineProperty");
  }
  if (((ulong)propertyRecord & 0xfffffe) == 0) {
LAB_00d0fee5:
    JavascriptError::ThrowTypeError
              ((ScriptContext *)args.super_Arguments.Values,-0x7ff5ec36,L"Reflect.defineProperty");
  }
  pvVar6 = Arguments::operator[]((Arguments *)&propertyRecord,1);
  BVar3 = JavascriptOperators::IsObject(pvVar6);
  if (BVar3 == 0) goto LAB_00d0fee5;
  pvVar6 = Arguments::operator[]((Arguments *)&propertyRecord,1);
  argument = pRVar7;
  if (2 < ((uint)propertyRecord & 0xffffff)) {
    argument = (RecyclableObject *)Arguments::operator[]((Arguments *)&propertyRecord,2);
  }
  JavascriptConversion::ToPropertyKey
            (argument,(ScriptContext *)args.super_Arguments.Values,
             (PropertyRecord **)&callInfo_local,(PropertyString **)0x0);
  if (((ulong)propertyRecord & 0xfffffc) != 0) {
    pRVar7 = (RecyclableObject *)Arguments::operator[]((Arguments *)&propertyRecord,3);
  }
  PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_c0);
  BVar3 = JavascriptOperators::ToPropertyDescriptor
                    (pRVar7,(PropertyDescriptor *)local_c0,
                     (ScriptContext *)args.super_Arguments.Values);
  if (BVar3 == 0) {
    pPVar8 = ScriptContext::GetPropertyName
                       ((ScriptContext *)args.super_Arguments.Values,
                        *(PropertyId *)((long)callInfo_local + 8));
    JavascriptError::ThrowTypeError
              ((ScriptContext *)args.super_Arguments.Values,-0x7ff5ec2c,(PCWSTR)(pPVar8 + 1));
  }
  if (pvVar6 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_00d0fee3;
    *puVar5 = 0;
  }
  if (((ulong)pvVar6 & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)pvVar6 & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00d0fee3;
    *puVar5 = 0;
  }
  TVar9 = TypeIds_FirstNumberType;
  if ((((ulong)pvVar6 & 0xffff000000000000) != 0x1000000000000) &&
     (TVar9 = TypeIds_Number, (ulong)pvVar6 >> 0x32 == 0)) {
    pRVar7 = UnsafeVarTo<Js::RecyclableObject>(pvVar6);
    if (pRVar7 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_00d0fee3;
      *puVar5 = 0;
    }
    TVar9 = ((pRVar7->type).ptr)->typeId;
    if (0x57 < (int)TVar9) {
      BVar3 = RecyclableObject::IsExternal(pRVar7);
      if (BVar3 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) {
LAB_00d0fee3:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
    }
  }
  if (TVar9 == TypeIds_HostDispatch) {
    pRVar7 = VarTo<Js::RecyclableObject>(pvVar6);
    pPVar8 = propertyRecord;
    propertyDescriptor.Configurable = propertyRecord._0_1_;
    propertyDescriptor.fromProxy = propertyRecord._1_1_;
    propertyDescriptor._42_2_ = propertyRecord._2_2_;
    propertyDescriptor._44_4_ = propertyRecord._4_4_;
    propertyRecord = pPVar8;
    iVar4 = (*(pRVar7->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x55])
                      (pRVar7,EntryDefineProperty,&propertyDescriptor.Configurable,0);
  }
  else {
    pRVar7 = VarTo<Js::RecyclableObject>(pvVar6);
    iVar4 = JavascriptObject::DefineOwnPropertyHelper
                      (pRVar7,*(PropertyId *)((long)callInfo_local + 8),
                       (PropertyDescriptor *)local_c0,(ScriptContext *)args.super_Arguments.Values,
                       false);
  }
  pvVar6 = *(Var *)((long)args.super_Arguments.Values[1] + (ulong)(iVar4 == 0) * 8 + 1000);
  AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_80);
  return pvVar6;
}

Assistant:

Var JavascriptReflect::EntryDefineProperty(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        Var undefinedValue = scriptContext->GetLibrary()->GetUndefined();
        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Reflect.defineProperty"));

        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
        if  (args.Info.Flags & CallFlags_New)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_ErrorOnNew, _u("Reflect.defineProperty"));
        }

        Var propertyKey, attributes;
        if (args.Info.Count < 2 || !JavascriptOperators::IsObject(args[1]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, _u("Reflect.defineProperty"));
        }
        Var target = args[1];

        propertyKey = args.Info.Count > 2 ? args[2] : undefinedValue;
        PropertyRecord const * propertyRecord;
        JavascriptConversion::ToPropertyKey(propertyKey, scriptContext, &propertyRecord, nullptr);

        attributes = args.Info.Count > 3 ? args[3] : undefinedValue;
        PropertyDescriptor propertyDescriptor;
        if (!JavascriptOperators::ToPropertyDescriptor(attributes, &propertyDescriptor, scriptContext))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_PropertyDescriptor_Invalid, scriptContext->GetPropertyName(propertyRecord->GetPropertyId())->GetBuffer());
        }

        // If the object is HostDispatch try to invoke the operation remotely
        BOOL defineResult;
        if (JavascriptOperators::GetTypeId(target) == TypeIds_HostDispatch)
        {
            defineResult = VarTo<RecyclableObject>(target)->InvokeBuiltInOperationRemotely(EntryDefineProperty, args, nullptr);
        }
        else
        {
            defineResult = JavascriptObject::DefineOwnPropertyHelper(VarTo<RecyclableObject>(target), propertyRecord->GetPropertyId(), propertyDescriptor, scriptContext, false);
        }

        return scriptContext->GetLibrary()->GetTrueOrFalse(defineResult);
    }